

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

Curl_addrinfo * Curl_resolver_getaddrinfo(connectdata *conn,char *hostname,int port,int *waitp)

{
  undefined1 *puVar1;
  time_t *ptVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  Curl_addrinfo *pCVar6;
  undefined8 *puVar7;
  pthread_mutex_t *__mutex;
  char *pcVar8;
  pthread_t *ppVar9;
  int *piVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Curl_async *async;
  int iVar13;
  curltime cVar14;
  char sbuf [12];
  char local_50 [16];
  int *local_40;
  Curl_easy *local_38;
  
  local_38 = conn->data;
  ptVar2 = (time_t *)(local_38->state).resolver;
  *waitp = 0;
  local_40 = waitp;
  iVar5 = inet_pton(2,hostname,local_50);
  if (0 < iVar5) {
    pCVar6 = Curl_ip2addr(2,local_50,hostname,port);
    return pCVar6;
  }
  iVar5 = inet_pton(10,hostname,local_50);
  if (0 < iVar5) {
    pCVar6 = Curl_ip2addr(10,local_50,hostname,port);
    return pCVar6;
  }
  if (conn->ip_version == 1) {
    bVar3 = true;
    uVar12 = 2;
  }
  else if (conn->ip_version == 2) {
    uVar12 = 10;
    bVar3 = false;
  }
  else {
    bVar3 = false;
    uVar12 = 0;
  }
  uVar11 = 2;
  if (!bVar3) {
    _Var4 = Curl_ipv6works();
    uVar11 = 2;
    if (_Var4) {
      uVar11 = uVar12;
    }
  }
  iVar5 = conn->socktype;
  curl_msnprintf(local_50,0xc,"%d");
  cVar14 = Curl_now();
  *ptVar2 = cVar14.tv_sec;
  *(int *)(ptVar2 + 1) = cVar14.tv_usec;
  puVar7 = (undefined8 *)(*Curl_ccalloc)(1,0x78);
  (conn->async).os_specific = puVar7;
  iVar13 = 0xc;
  if (puVar7 != (undefined8 *)0x0) {
    (conn->async).port = port;
    puVar1 = &(conn->async).field_0x28;
    *puVar1 = *puVar1 & 0xfe;
    (conn->async).status = 0;
    (conn->async).dns = (Curl_dns_entry *)0x0;
    *puVar7 = 0;
    puVar7[0xd] = 0;
    puVar7[0xe] = 0;
    puVar7[5] = 0;
    puVar7[6] = 0;
    puVar7[3] = 0;
    puVar7[4] = 0;
    puVar7[7] = 0;
    puVar7[8] = 0;
    puVar7[9] = 0;
    puVar7[10] = 0;
    puVar7[0xb] = 0;
    puVar7[0xc] = 0;
    puVar7[0xe] = puVar7;
    *(int *)(puVar7 + 6) = port;
    *(undefined4 *)(puVar7 + 4) = 1;
    *(undefined4 *)(puVar7 + 8) = 0;
    *(undefined4 *)((long)puVar7 + 0x44) = uVar11;
    *(int *)(puVar7 + 9) = iVar5;
    *(undefined8 *)((long)puVar7 + 0x4c) = 0;
    *(undefined8 *)((long)puVar7 + 0x54) = 0;
    *(undefined8 *)((long)puVar7 + 0x5c) = 0;
    *(undefined8 *)((long)puVar7 + 100) = 0;
    *(undefined4 *)((long)puVar7 + 0x6c) = 0;
    __mutex = (pthread_mutex_t *)(*Curl_cmalloc)(0x28);
    puVar7[3] = __mutex;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      *(undefined4 *)((long)puVar7 + 0x34) = 0;
      pcVar8 = (*Curl_cstrdup)(hostname);
      puVar7[5] = pcVar8;
      if (pcVar8 != (char *)0x0) {
        async = &conn->async;
        (*Curl_cfree)(async->hostname);
        pcVar8 = (*Curl_cstrdup)(hostname);
        async->hostname = pcVar8;
        if (pcVar8 == (char *)0x0) {
          iVar13 = 0xc;
        }
        else {
          *(undefined4 *)(puVar7 + 4) = 0;
          ppVar9 = Curl_thread_create(getaddrinfo_thread,(thread_sync_data *)(puVar7 + 3));
          *puVar7 = ppVar9;
          if (ppVar9 != (pthread_t *)0x0) {
            *local_40 = 1;
            return (Curl_addrinfo *)0x0;
          }
          *(undefined4 *)(puVar7 + 4) = 1;
          piVar10 = __errno_location();
          iVar13 = *piVar10;
        }
        destroy_async_data(async);
        goto LAB_00139964;
      }
    }
    destroy_thread_sync_data((thread_sync_data *)(puVar7 + 3));
    (conn->async).os_specific = (void *)0x0;
    (*Curl_cfree)(puVar7);
  }
LAB_00139964:
  piVar10 = __errno_location();
  *piVar10 = iVar13;
  Curl_failf(local_38,"getaddrinfo() thread failed to start\n");
  return (Curl_addrinfo *)0x0;
}

Assistant:

Curl_addrinfo *Curl_resolver_getaddrinfo(struct connectdata *conn,
                                         const char *hostname,
                                         int port,
                                         int *waitp)
{
  struct addrinfo hints;
  char sbuf[12];
  int pf = PF_INET;
  struct Curl_easy *data = conn->data;
  struct resdata *reslv = (struct resdata *)data->state.resolver;

  *waitp = 0; /* default to synchronous response */

#ifndef USE_RESOLVE_ON_IPS
  {
    struct in_addr in;
    /* First check if this is an IPv4 address string */
    if(Curl_inet_pton(AF_INET, hostname, &in) > 0)
      /* This is a dotted IP address 123.123.123.123-style */
      return Curl_ip2addr(AF_INET, &in, hostname, port);
  }
#ifdef CURLRES_IPV6
  {
    struct in6_addr in6;
    /* check if this is an IPv6 address string */
    if(Curl_inet_pton(AF_INET6, hostname, &in6) > 0)
      /* This is an IPv6 address literal */
      return Curl_ip2addr(AF_INET6, &in6, hostname, port);
  }
#endif /* CURLRES_IPV6 */
#endif /* !USE_RESOLVE_ON_IPS */

#ifdef CURLRES_IPV6
  /*
   * Check if a limited name resolve has been requested.
   */
  switch(conn->ip_version) {
  case CURL_IPRESOLVE_V4:
    pf = PF_INET;
    break;
  case CURL_IPRESOLVE_V6:
    pf = PF_INET6;
    break;
  default:
    pf = PF_UNSPEC;
    break;
  }

  if((pf != PF_INET) && !Curl_ipv6works())
    /* The stack seems to be a non-IPv6 one */
    pf = PF_INET;
#endif /* CURLRES_IPV6 */

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = conn->socktype;

  msnprintf(sbuf, sizeof(sbuf), "%d", port);

  reslv->start = Curl_now();
  /* fire up a new resolver thread! */
  if(init_resolve_thread(conn, hostname, port, &hints)) {
    *waitp = 1; /* expect asynchronous response */
    return NULL;
  }

  failf(data, "getaddrinfo() thread failed to start\n");
  return NULL;

}